

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O3

void Maj_ManFree(Maj_Man_t *p)

{
  Vec_Wrd_t *__ptr;
  word *__ptr_00;
  Vec_Wec_t *__ptr_01;
  void *__ptr_02;
  int iVar1;
  Vec_Int_t *__ptr_03;
  long lVar2;
  long lVar3;
  
  bmcg_sat_solver_stop(p->pSat);
  __ptr = p->vInfo;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (word *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  __ptr_01 = p->vOutLits;
  iVar1 = __ptr_01->nCap;
  __ptr_03 = __ptr_01->pArray;
  if (iVar1 < 1) {
    if (__ptr_03 == (Vec_Int_t *)0x0) {
      free(__ptr_01);
      goto LAB_005a2b1d;
    }
  }
  else {
    lVar3 = 8;
    lVar2 = 0;
    do {
      __ptr_02 = *(void **)((long)&__ptr_03->nCap + lVar3);
      if (__ptr_02 != (void *)0x0) {
        free(__ptr_02);
        __ptr_03 = __ptr_01->pArray;
        *(undefined8 *)((long)&__ptr_03->nCap + lVar3) = 0;
        iVar1 = __ptr_01->nCap;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 < iVar1);
  }
  free(__ptr_03);
  free(__ptr_01);
  if (p == (Maj_Man_t *)0x0) {
    return;
  }
LAB_005a2b1d:
  free(p);
  return;
}

Assistant:

void Maj_ManFree( Maj_Man_t * p )
{
    bmcg_sat_solver_stop( p->pSat );
    Vec_WrdFree( p->vInfo );
    Vec_WecFree( p->vOutLits );
    ABC_FREE( p );
}